

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O0

void gl_RecalcVertexHeights(vertex_t *v)

{
  int iVar1;
  double dVar2;
  float local_20;
  int local_1c;
  float height;
  int k;
  int j;
  int i;
  vertex_t *v_local;
  
  v->numheights = 0;
  k = 0;
  do {
    if (v->numsectors <= k) {
      if (v->numheights < 3) {
        v->numheights = 0;
      }
      v->dirty = false;
      return;
    }
    for (height = 0.0; (int)height < 2; height = (float)((int)height + 1)) {
      if (height == 0.0) {
        dVar2 = secplane_t::ZatPoint(&v->sectors[k]->ceilingplane,v);
      }
      else {
        dVar2 = secplane_t::ZatPoint(&v->sectors[k]->floorplane,v);
      }
      local_20 = (float)dVar2;
      for (local_1c = 0; local_1c < v->numheights; local_1c = local_1c + 1) {
        if ((local_20 == v->heightlist[local_1c]) &&
           (!NAN(local_20) && !NAN(v->heightlist[local_1c]))) break;
        if (local_20 < v->heightlist[local_1c]) {
          memmove(v->heightlist + (local_1c + 1),v->heightlist + local_1c,
                  (long)(v->numheights - local_1c) << 2);
          v->heightlist[local_1c] = local_20;
          v->numheights = v->numheights + 1;
          break;
        }
      }
      if (local_1c == v->numheights) {
        iVar1 = v->numheights;
        v->numheights = iVar1 + 1;
        v->heightlist[iVar1] = local_20;
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

void gl_RecalcVertexHeights(vertex_t * v)
{
	int i,j,k;
	float height;

	v->numheights=0;
	for(i=0;i<v->numsectors;i++)
	{
		for(j=0;j<2;j++)
		{
			if (j==0) height=v->sectors[i]->ceilingplane.ZatPoint(v);
			else height=v->sectors[i]->floorplane.ZatPoint(v);

			for(k=0;k<v->numheights;k++)
			{
				if (height == v->heightlist[k]) break;
				if (height < v->heightlist[k])
				{
					memmove(&v->heightlist[k+1], &v->heightlist[k], sizeof(float) * (v->numheights-k));
					v->heightlist[k]=height;
					v->numheights++;
					break;
				}
			}
			if (k==v->numheights) v->heightlist[v->numheights++]=height;
		}
	}
	if (v->numheights<=2) v->numheights=0;	// is not in need of any special attention
	v->dirty = false;
}